

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_nonce_gen_internal
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *input_nonce,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  secp256k1_musig_pubnonce *psVar7;
  secp256k1_musig_secnonce *secnonce_00;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  secp256k1_musig_pubnonce *pubnonce_00;
  secp256k1_context *psVar12;
  secp256k1_gej *a;
  secp256k1_keyagg_cache_internal *psVar13;
  secp256k1_scalar *r;
  secp256k1_musig_secnonce *psVar14;
  secp256k1_context *ctx_00;
  secp256k1_sha256 *psVar15;
  uchar *puVar16;
  secp256k1_pubkey *msg32_00;
  secp256k1_ge *a_00;
  byte bVar17;
  secp256k1_scalar k [2];
  uchar rand [32];
  size_t pk_ser_len;
  secp256k1_ge nonce_pts [2];
  uchar buf [32];
  uchar pk_ser [33];
  secp256k1_gej nonce_ptj [2];
  secp256k1_ge pk;
  uchar aggpk_ser [32];
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  ulong auStack_480 [10];
  secp256k1_pubkey sStack_430;
  secp256k1_context *psStack_3e8;
  secp256k1_keyagg_cache_internal *psStack_3e0;
  uchar *puStack_3d8;
  secp256k1_musig_pubnonce *psStack_3d0;
  secp256k1_sha256 *psStack_3c8;
  code *pcStack_3c0;
  uchar local_3b1;
  uint local_3b0;
  undefined4 uStack_3ac;
  secp256k1_fe local_3a8;
  secp256k1_context *local_370;
  undefined1 local_368 [8];
  uint64_t local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  uint64_t local_348;
  uint64_t uStack_340;
  size_t local_330;
  secp256k1_musig_pubnonce *local_328;
  secp256k1_musig_secnonce *local_320;
  undefined1 local_318 [8];
  secp256k1_keyagg_cache_internal *psStack_310;
  uint64_t local_308;
  uint64_t uStack_300;
  uint64_t local_2f8;
  uint64_t uStack_2f0;
  uint64_t local_2e8;
  uint64_t uStack_2e0;
  uint64_t local_2d8;
  uint64_t uStack_2d0;
  _func_void_char_ptr_void_ptr *local_2c8;
  void *pvStack_2c0;
  _func_void_char_ptr_void_ptr *local_2b8;
  secp256k1_fe local_2b0 [2];
  uchar local_248 [32];
  undefined1 local_228 [48];
  secp256k1_keyagg_cache_internal local_1f8;
  secp256k1_fe local_100;
  int local_c0;
  
  bVar17 = 0;
  local_330 = 0x21;
  if (pubnonce != (secp256k1_musig_pubnonce *)0x0) {
    pcStack_3c0 = (code *)0x1114ce;
    puVar16 = seckey;
    msg32_00 = pubkey;
    memset(pubnonce,0,0x84);
    if ((pubkey != (secp256k1_pubkey *)0x0) && ((ctx->ecmult_gen_ctx).built != 0)) {
      local_370 = ctx;
      local_328 = pubnonce;
      local_320 = secnonce;
      if (seckey == (uchar *)0x0) {
        local_3b0 = 1;
      }
      else {
        pcStack_3c0 = (code *)0x111519;
        local_3b0 = secp256k1_scalar_set_b32_seckey
                              ((secp256k1_scalar *)&stack0xffffffffffffff40,seckey);
        local_c0 = 0;
        local_1f8.pk.x.n[0] = 0x4d430001;
        local_1f8.pk.x.n[2] = 4;
        local_1f8.pk.x.n[3] = 0;
        local_1f8.pk.x.n[4] = 0;
        local_1f8.pk.x.magnitude = 0;
        local_1f8.pk.x.normalized = 0;
        local_318 = (undefined1  [8])0x0;
        pubnonce = (secp256k1_musig_pubnonce *)&stack0xffffffffffffff40;
        local_1f8.pk.x.n[1] = (uint64_t)&stack0xffffffffffffff40;
      }
      r = (secp256k1_scalar *)0x0;
      if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
        pcStack_3c0 = (code *)0x111598;
        uVar8 = secp256k1_keyagg_cache_load(local_370,&local_1f8,keyagg_cache);
        pubnonce = (secp256k1_musig_pubnonce *)(ulong)uVar8;
        psVar12 = (secp256k1_context *)0x0;
        if (uVar8 == 0) goto LAB_00111cf1;
        r = (secp256k1_scalar *)&stack0xffffffffffffffa8;
        pcStack_3c0 = (code *)0x1115b9;
        secp256k1_fe_get_b32((uchar *)r,(secp256k1_fe *)&local_1f8);
      }
      pcStack_3c0 = (code *)0x1115db;
      iVar9 = secp256k1_pubkey_load(local_370,(secp256k1_ge *)&stack0xffffffffffffff40,pubkey);
      psVar12 = (secp256k1_context *)0x0;
      if (iVar9 == 0) goto LAB_00111cf1;
      ctx_00 = (secp256k1_context *)&stack0xffffffffffffff40;
      psVar14 = (secp256k1_musig_secnonce *)local_228;
      uVar11 = 1;
      pcStack_3c0 = (code *)0x11160a;
      iVar9 = secp256k1_eckey_pubkey_serialize((secp256k1_ge *)ctx_00,(uchar *)psVar14,&local_330,1)
      ;
      if (iVar9 == 0) {
        pcStack_3c0 = (code *)0x111d34;
        secp256k1_musig_nonce_gen_internal_cold_5();
LAB_00111d34:
        pcStack_3c0 = (code *)0x111d39;
        secp256k1_musig_nonce_gen_internal_cold_1();
      }
      else {
        if (local_330 != 0x21) goto LAB_00111d34;
        if (seckey == (uchar *)0x0) {
          local_358 = *(uint64_t *)input_nonce;
          uStack_350 = *(uint64_t *)(input_nonce + 8);
          local_348 = *(uint64_t *)(input_nonce + 0x10);
          uStack_340 = *(uint64_t *)(input_nonce + 0x18);
        }
        else {
          local_1f8.pk.x.n[0] = 0xf463fe7ea19e884b;
          local_1f8.pk.x.n[1] = 0xbeb0f9ff2f18f9a2;
          local_1f8.pk.x.n[2] = 0x6ebd26f0f37e8b0;
          local_1f8.pk.x.n[3] = 0x522fb150e3b243d2;
          local_1f8.pk.infinity = 0x40;
          local_1f8.pk._100_4_ = 0;
          pcStack_3c0 = (code *)0x111663;
          secp256k1_sha256_write((secp256k1_sha256 *)&local_1f8,input_nonce,0x20);
          pcStack_3c0 = (code *)0x111670;
          secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1f8,(uchar *)&local_358);
          lVar10 = 0;
          do {
            puVar1 = (uint *)(seckey + lVar10);
            uVar8 = puVar1[1];
            uVar3 = puVar1[2];
            uVar4 = puVar1[3];
            uVar5 = *(uint *)((long)&uStack_350 + lVar10);
            uVar6 = *(uint *)((long)&uStack_350 + lVar10 + 4);
            *(uint *)((long)&local_358 + lVar10) = *puVar1 ^ *(uint *)((long)&local_358 + lVar10);
            *(uint *)((long)&local_358 + lVar10 + 4) =
                 uVar8 ^ *(uint *)((long)&local_358 + lVar10 + 4);
            *(uint *)((long)&uStack_350 + lVar10) = uVar3 ^ uVar5;
            *(uint *)((long)&uStack_350 + lVar10 + 4) = uVar4 ^ uVar6;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x20);
          local_3b1 = ' ';
        }
        local_1f8.pk.x.n[0] = 0x1800341407101b64;
        local_1f8.pk.x.n[1] = 0xe6258ee0391bc43;
        local_1f8.pk.x.n[2] = 0x8343937e29d26b72;
        local_1f8.pk.x.n[3] = 0xff568a30b7a0a4fb;
        local_1f8.pk.infinity = 0x40;
        local_1f8.pk._100_4_ = 0;
        pcStack_3c0 = (code *)0x1116e6;
        secp256k1_sha256_write((secp256k1_sha256 *)&local_1f8,(uchar *)&local_358,0x20);
        pcStack_3c0 = (code *)0x111700;
        secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)&local_1f8,1,local_228,'!');
        pcStack_3c0 = (code *)0x111715;
        secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)&local_1f8,1,(uchar *)r,' ');
        uStack_3ac = CONCAT13(msg32 != (uchar *)0x0,(undefined3)uStack_3ac);
        pcStack_3c0 = (code *)0x11172d;
        secp256k1_sha256_write((secp256k1_sha256 *)&local_1f8,(uchar *)((long)&uStack_3ac + 3),1);
        if (msg32 != (uchar *)0x0) {
          pcStack_3c0 = (code *)0x11174c;
          secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)&local_1f8,8,msg32,' ');
        }
        seckey = (uchar *)&local_1f8;
        pcStack_3c0 = (code *)0x111769;
        secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)seckey,4,extra_input32,' ');
        local_3b1 = '\0';
        pubkey = (secp256k1_pubkey *)0xffffffffffffffff;
        r = (secp256k1_scalar *)local_368;
        input_nonce = local_318;
        pubnonce = (secp256k1_musig_pubnonce *)0x0;
        do {
          psVar13 = (secp256k1_keyagg_cache_internal *)seckey;
          psVar15 = (secp256k1_sha256 *)input_nonce;
          for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
            *(uint64_t *)psVar15->s = (psVar13->pk).x.n[0];
            psVar13 = (secp256k1_keyagg_cache_internal *)((long)psVar13 + (ulong)bVar17 * -0x10 + 8)
            ;
            psVar15 = (secp256k1_sha256 *)((long)psVar15 + (ulong)bVar17 * -0x10 + 8);
          }
          pcStack_3c0 = (code *)0x1117b0;
          secp256k1_sha256_write((secp256k1_sha256 *)input_nonce,&local_3b1,1);
          pcStack_3c0 = (code *)0x1117bb;
          secp256k1_sha256_finalize((secp256k1_sha256 *)input_nonce,local_248);
          pcStack_3c0 = (code *)0x1117c8;
          secp256k1_scalar_set_b32(r,local_248,(int *)0x0);
          local_248[0x10] = '\0';
          local_248[0x11] = '\0';
          local_248[0x12] = '\0';
          local_248[0x13] = '\0';
          local_248[0x14] = '\0';
          local_248[0x15] = '\0';
          local_248[0x16] = '\0';
          local_248[0x17] = '\0';
          local_248[0x18] = '\0';
          local_248[0x19] = '\0';
          local_248[0x1a] = '\0';
          local_248[0x1b] = '\0';
          local_248[0x1c] = '\0';
          local_248[0x1d] = '\0';
          local_248[0x1e] = '\0';
          local_248[0x1f] = '\0';
          local_248[0] = '\0';
          local_248[1] = '\0';
          local_248[2] = '\0';
          local_248[3] = '\0';
          local_248[4] = '\0';
          local_248[5] = '\0';
          local_248[6] = '\0';
          local_248[7] = '\0';
          local_248[8] = '\0';
          local_248[9] = '\0';
          local_248[10] = '\0';
          local_248[0xb] = '\0';
          local_248[0xc] = '\0';
          local_248[0xd] = '\0';
          local_248[0xe] = '\0';
          local_248[0xf] = '\0';
          uVar11 = 0x4d430001;
          local_318 = (undefined1  [8])0x0;
          psStack_310 = (secp256k1_keyagg_cache_internal *)0x0;
          local_308 = 0;
          uStack_300 = 0;
          local_2f8 = 0;
          uStack_2f0 = 0;
          local_2e8 = 0;
          uStack_2e0 = 0;
          local_2d8 = 0;
          uStack_2d0 = 0;
          local_2c8 = (_func_void_char_ptr_void_ptr *)0x0;
          pvStack_2c0 = (void *)0x0;
          local_2b8 = (_func_void_char_ptr_void_ptr *)0x0;
          local_3a8.n[0] = 0x4d430001;
          local_3a8.n[2] = 0x68;
          local_3a8.n[3] = 0;
          local_3a8.n[4] = 0;
          local_3a8.magnitude = 0;
          local_3a8.normalized = 0;
          local_360 = 0;
          local_3b1 = (char)pubkey + '\x02';
          r = r + 1;
          pubkey = (secp256k1_pubkey *)((long)pubkey + 1);
          local_3a8.n[1] = (uint64_t)input_nonce;
        } while (pubkey == (secp256k1_pubkey *)0x0);
        local_348 = 0;
        uStack_340 = 0;
        local_358 = 0;
        uStack_350 = 0;
        psVar14 = (secp256k1_musig_secnonce *)0x0;
        local_1f8.pk.x.n[0] = 0;
        local_1f8.pk.x.n[1] = 0;
        local_1f8.pk.x.n[2] = 0;
        local_1f8.pk.x.n[3] = 0;
        local_1f8.pk.x.n[4] = 0;
        local_1f8.pk.x.magnitude = 0;
        local_1f8.pk.x.normalized = 0;
        local_1f8.pk.y.n[0] = 0;
        local_1f8.pk.y.n[1] = 0;
        local_1f8.pk.y.n[2] = 0;
        local_1f8.pk.y.n[3] = 0;
        local_1f8.pk.y.n[4] = 0;
        local_1f8.pk.y.magnitude = 0;
        local_1f8.pk.y.normalized = 0;
        local_1f8.pk._96_8_ = 0;
        local_318 = (undefined1  [8])0x4d430001;
        local_308 = 0x68;
        uStack_300 = 0;
        local_2f8 = 0;
        uStack_2f0 = 0;
        local_3a8.n[0] = 0;
        psVar12 = (secp256k1_context *)local_368;
        pcStack_3c0 = (code *)0x111986;
        ctx_00 = psVar12;
        psStack_310 = (secp256k1_keyagg_cache_internal *)seckey;
        secp256k1_scalar_verify((secp256k1_scalar *)psVar12);
        if (local_368._0_4_ != 0) {
          psVar12 = (secp256k1_context *)(local_368 + 4);
          pcStack_3c0 = (code *)0x11199c;
          ctx_00 = psVar12;
          secp256k1_scalar_verify((secp256k1_scalar *)psVar12);
          secnonce_00 = local_320;
          if (local_368._4_4_ != 0) {
            psVar14 = local_320;
            psVar14->data[0] = '\"';
            psVar14->data[1] = '\x0e';
            psVar14->data[2] = 0xdc;
            psVar14->data[3] = 0xf1;
            pcStack_3c0 = (code *)0x1119c1;
            secp256k1_scalar_verify((secp256k1_scalar *)local_368);
            psVar14->data[0x14] = '\0';
            psVar14->data[0x15] = '\0';
            psVar14->data[0x16] = '\0';
            psVar14->data[0x17] = '\0';
            psVar14->data[0x18] = '\0';
            psVar14->data[0x19] = '\0';
            psVar14->data[0x1a] = '\0';
            psVar14->data[0x1b] = '\0';
            psVar14->data[0x1c] = '\0';
            psVar14->data[0x1d] = '\0';
            psVar14->data[0x1e] = '\0';
            psVar14->data[0x1f] = '\0';
            psVar14->data[0x20] = '\0';
            psVar14->data[0x21] = '\0';
            psVar14->data[0x22] = '\0';
            psVar14->data[0x23] = '\0';
            psVar14->data[4] = '\0';
            psVar14->data[5] = '\0';
            psVar14->data[6] = '\0';
            psVar14->data[7] = '\0';
            psVar14->data[8] = '\0';
            psVar14->data[9] = '\0';
            psVar14->data[10] = '\0';
            psVar14->data[0xb] = '\0';
            psVar14->data[0xc] = '\0';
            psVar14->data[0xd] = '\0';
            psVar14->data[0xe] = '\0';
            psVar14->data[0xf] = '\0';
            psVar14->data[0x10] = '\0';
            psVar14->data[0x11] = '\0';
            psVar14->data[0x12] = '\0';
            psVar14->data[0x13] = '\0';
            *(uint *)(secnonce_00->data + 0x20) =
                 (uint)local_368._0_4_ >> 0x18 | (local_368._0_4_ & 0xff0000) >> 8 |
                 (local_368._0_4_ & 0xff00) << 8 | local_368._0_4_ << 0x18;
            pcStack_3c0 = (code *)0x1119df;
            secp256k1_scalar_verify((secp256k1_scalar *)psVar12);
            psVar14->data[0x34] = '\0';
            psVar14->data[0x35] = '\0';
            psVar14->data[0x36] = '\0';
            psVar14->data[0x37] = '\0';
            psVar14->data[0x38] = '\0';
            psVar14->data[0x39] = '\0';
            psVar14->data[0x3a] = '\0';
            psVar14->data[0x3b] = '\0';
            psVar14->data[0x3c] = '\0';
            psVar14->data[0x3d] = '\0';
            psVar14->data[0x3e] = '\0';
            psVar14->data[0x3f] = '\0';
            psVar14->data[0x40] = '\0';
            psVar14->data[0x41] = '\0';
            psVar14->data[0x42] = '\0';
            psVar14->data[0x43] = '\0';
            psVar14->data[0x24] = '\0';
            psVar14->data[0x25] = '\0';
            psVar14->data[0x26] = '\0';
            psVar14->data[0x27] = '\0';
            psVar14->data[0x28] = '\0';
            psVar14->data[0x29] = '\0';
            psVar14->data[0x2a] = '\0';
            psVar14->data[0x2b] = '\0';
            psVar14->data[0x2c] = '\0';
            psVar14->data[0x2d] = '\0';
            psVar14->data[0x2e] = '\0';
            psVar14->data[0x2f] = '\0';
            psVar14->data[0x30] = '\0';
            psVar14->data[0x31] = '\0';
            psVar14->data[0x32] = '\0';
            psVar14->data[0x33] = '\0';
            *(uint *)(secnonce_00->data + 0x40) =
                 (uint)local_368._4_4_ >> 0x18 | (local_368._4_4_ & 0xff0000) >> 8 |
                 (local_368._4_4_ & 0xff00) << 8 | local_368._4_4_ << 0x18;
            pcStack_3c0 = (code *)0x111a07;
            secp256k1_ge_to_bytes(secnonce_00->data + 0x44,(secp256k1_ge *)&stack0xffffffffffffff40)
            ;
            psVar12 = local_370;
            pcStack_3c0 = (code *)0x111a1e;
            secp256k1_musig_secnonce_invalidate(local_370,secnonce_00,local_3b0 ^ 1);
            lVar10 = 0;
            do {
              psVar13 = (secp256k1_keyagg_cache_internal *)(local_368 + lVar10);
              pcStack_3c0 = (code *)0x111a42;
              secp256k1_ecmult_gen
                        (&psVar12->ecmult_gen_ctx,(secp256k1_gej *)seckey,
                         (secp256k1_scalar *)psVar13);
              *(uint32_t *)(psVar13->pk).x.n = 0;
              local_318 = (undefined1  [8])0x4d430001;
              local_308 = 4;
              uStack_300 = 0;
              local_2f8 = 0;
              uStack_2f0 = 0;
              local_3a8.n[0] = 0;
              lVar10 = lVar10 + 4;
              seckey = (uchar *)&(((secp256k1_keyagg_cache_internal *)seckey)->second_pk).y;
              psStack_310 = psVar13;
            } while (lVar10 == 4);
            lVar10 = 0;
            do {
              a = (secp256k1_gej *)((long)local_1f8.pk.x.n + lVar10);
              pcStack_3c0 = (code *)0x111ad4;
              secp256k1_gej_verify(a);
              pcStack_3c0 = (code *)0x111adc;
              secp256k1_gej_verify(a);
              if (*(int *)((long)local_1f8.second_pk.x.n + lVar10 + 0x28) != 0) {
                pcStack_3c0 = (code *)0x111d0a;
                secp256k1_musig_nonce_gen_internal_cold_2();
                goto LAB_00111d23;
              }
              lVar10 = lVar10 + 0x98;
            } while (lVar10 == 0x98);
            local_2f8 = local_1f8.second_pk.x.n[3];
            uStack_2f0 = local_1f8.second_pk.x.n[4];
            local_308 = local_1f8.second_pk.x.n[1];
            uStack_300 = local_1f8.second_pk.x.n[2];
            local_318 = (undefined1  [8])local_1f8.pk._96_8_;
            psStack_310 = (secp256k1_keyagg_cache_internal *)local_1f8.second_pk.x.n[0];
            a_00 = (secp256k1_ge *)local_318;
            pcStack_3c0 = (code *)0x111b38;
            secp256k1_fe_mul(local_2b0,(secp256k1_fe *)a_00,&local_100);
            pcStack_3c0 = (code *)0x111b48;
            secp256k1_fe_inv(&local_3a8,local_2b0);
            pcStack_3c0 = (code *)0x111b56;
            secp256k1_fe_mul(local_2b0,(secp256k1_fe *)a_00,&local_3a8);
            pcStack_3c0 = (code *)0x111b64;
            secp256k1_fe_mul(&local_3a8,&local_3a8,&local_100);
            local_2f8 = local_3a8.n[4];
            uStack_2f0._0_4_ = local_3a8.magnitude;
            uStack_2f0._4_4_ = local_3a8.normalized;
            local_308 = local_3a8.n[2];
            uStack_300 = local_3a8.n[3];
            local_318 = (undefined1  [8])local_3a8.n[0];
            psStack_310 = (secp256k1_keyagg_cache_internal *)local_3a8.n[1];
            psVar13 = &local_1f8;
            lVar10 = 0;
            do {
              pcStack_3c0 = (code *)0x111ba4;
              secp256k1_ge_set_gej_zinv
                        ((secp256k1_ge *)(local_318 + lVar10),(secp256k1_gej *)psVar13,
                         (secp256k1_fe *)(local_318 + lVar10));
              lVar10 = lVar10 + 0x68;
              psVar13 = (secp256k1_keyagg_cache_internal *)&(psVar13->second_pk).y;
            } while (lVar10 == 0x68);
            lVar10 = 0;
            do {
              pcStack_3c0 = (code *)0x111bc7;
              secp256k1_ge_verify((secp256k1_ge *)(local_318 + lVar10));
              lVar10 = lVar10 + 0x68;
            } while (lVar10 == 0x68);
            lVar10 = 0;
            do {
              psVar15 = (secp256k1_sha256 *)((long)local_1f8.pk.x.n + lVar10);
              pcStack_3c0 = (code *)0x111bfb;
              memset(psVar15,0,0x98);
              psVar7 = local_328;
              local_3a8.n[0] = 0x4d430001;
              local_3a8.n[2] = 0x98;
              local_3a8.n[3] = 0;
              local_3a8.n[4] = 0;
              local_3a8.magnitude = 0;
              local_3a8.normalized = 0;
              local_358 = 0;
              lVar10 = lVar10 + 0x98;
              local_3a8.n[1] = (uint64_t)psVar15;
            } while (lVar10 == 0x98);
            lVar10 = 0;
            psVar12 = local_370;
            do {
              if (psVar12->declassify != 0) {
                local_3a8.n[0] = 0x4d430002;
                local_3a8.n[1] = (uint64_t)(local_318 + lVar10);
                local_3a8.n[2] = 0x68;
                uVar11 = (ulong)((long)psVar12 << 3) >> 0x33;
                uVar2 = (((long)psVar12 << 3 | (ulong)psVar12 >> 0x3d) << 0xd | uVar11) >> 3;
                psVar12 = (secp256k1_context *)(uVar2 << 0x33 | (uVar11 << 0x3d | uVar2) >> 0xd);
              }
              local_358 = 0;
              local_3a8.magnitude = 0;
              local_3a8.normalized = 0;
              local_3a8.n[4] = 0;
              local_3a8.n[3] = 0;
              lVar10 = lVar10 + 0x68;
            } while (lVar10 == 0x68);
            local_328->data[0] = 0xf5;
            local_328->data[1] = 'z';
            local_328->data[2] = '=';
            local_328->data[3] = 0xa0;
            lVar10 = 0;
            do {
              pcStack_3c0 = (code *)0x111cdd;
              secp256k1_ge_to_bytes(psVar7->data + lVar10 + 4,a_00);
              lVar10 = lVar10 + 0x40;
              a_00 = a_00 + 1;
            } while (lVar10 == 0x40);
            psVar12 = (secp256k1_context *)(ulong)local_3b0;
            goto LAB_00111cf1;
          }
          goto LAB_00111d3e;
        }
      }
      pcStack_3c0 = (code *)0x111d3e;
      secp256k1_musig_nonce_gen_internal_cold_4();
LAB_00111d3e:
      pcStack_3c0 = secp256k1_musig_nonce_gen_counter;
      secp256k1_musig_nonce_gen_internal_cold_3();
      auStack_480[2] = 0;
      auStack_480[3] = 0;
      auStack_480[0] = 0;
      auStack_480[1] = 0;
      psStack_3e8 = psVar12;
      psStack_3e0 = (secp256k1_keyagg_cache_internal *)seckey;
      puStack_3d8 = pubkey->data;
      psStack_3d0 = pubnonce;
      psStack_3c8 = (secp256k1_sha256 *)input_nonce;
      pcStack_3c0 = (code *)r;
      if (ctx_00 == (secp256k1_context *)0x0) {
        secp256k1_musig_nonce_gen_counter_cold_3();
      }
      else if (psVar14 != (secp256k1_musig_secnonce *)0x0) {
        memset(psVar14,0,0x84);
        if (puVar16 == (uchar *)0x0) {
          secp256k1_musig_nonce_gen_counter_cold_1();
          return 0;
        }
        auStack_480[0] =
             uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
             uVar11 << 0x38;
        uStack_4a0 = *(undefined8 *)puVar16;
        uStack_498 = *(undefined8 *)(puVar16 + 8);
        uStack_490 = *(undefined8 *)(puVar16 + 0x10);
        uStack_488 = *(undefined8 *)(puVar16 + 0x18);
        sStack_430.data._0_8_ = *(undefined8 *)(puVar16 + 0x20);
        sStack_430.data._8_8_ = *(undefined8 *)(puVar16 + 0x28);
        sStack_430.data._16_8_ = *(undefined8 *)(puVar16 + 0x30);
        sStack_430.data._24_8_ = *(undefined8 *)(puVar16 + 0x38);
        sStack_430.data._32_8_ = *(undefined8 *)(puVar16 + 0x40);
        sStack_430.data._40_8_ = *(undefined8 *)(puVar16 + 0x48);
        sStack_430.data._48_8_ = *(undefined8 *)(puVar16 + 0x50);
        sStack_430.data._56_8_ = *(undefined8 *)(puVar16 + 0x58);
        iVar9 = secp256k1_musig_nonce_gen_internal
                          (ctx_00,psVar14,pubnonce_00,(uchar *)auStack_480,(uchar *)&uStack_4a0,
                           &sStack_430,msg32_00->data,
                           (secp256k1_musig_keyagg_cache *)CONCAT44(uStack_3ac,local_3b0),
                           (uchar *)local_3a8.n[0]);
        if (iVar9 == 0) {
          return 0;
        }
        return 1;
      }
      secp256k1_musig_nonce_gen_counter_cold_2();
      return 0;
    }
  }
LAB_00111d23:
  pcStack_3c0 = (code *)0x111d2b;
  secp256k1_musig_nonce_gen_internal_cold_6();
  psVar12 = (secp256k1_context *)0x0;
LAB_00111cf1:
  return (int)psVar12;
}

Assistant:

static int secp256k1_musig_nonce_gen_internal(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, const unsigned char *input_nonce, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    secp256k1_scalar k[2];
    secp256k1_ge nonce_pts[2];
    secp256k1_gej nonce_ptj[2];
    int i;
    unsigned char pk_ser[33];
    size_t pk_ser_len = sizeof(pk_ser);
    unsigned char aggpk_ser[32];
    unsigned char *aggpk_ser_ptr = NULL;
    secp256k1_ge pk;
    int pk_serialize_success;
    int ret = 1;

    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));

    /* Check that the seckey is valid to be able to sign for it later. */
    if (seckey != NULL) {
        secp256k1_scalar sk;
        ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey);
        secp256k1_scalar_clear(&sk);
    }

    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i;
        if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
            return 0;
        }
        /* The loaded point cache_i.pk can not be the point at infinity. */
        secp256k1_fe_get_b32(aggpk_ser, &cache_i.pk.x);
        aggpk_ser_ptr = aggpk_ser;
    }
    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    pk_serialize_success = secp256k1_eckey_pubkey_serialize(&pk, pk_ser, &pk_ser_len, 1);

#ifdef VERIFY
    /* A pubkey cannot be the point at infinity */
    VERIFY_CHECK(pk_serialize_success);
    VERIFY_CHECK(pk_ser_len == sizeof(pk_ser));
#else
    (void) pk_serialize_success;
#endif

    secp256k1_nonce_function_musig(k, input_nonce, msg32, seckey, pk_ser, aggpk_ser_ptr, extra_input32);
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[0]));
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[1]));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
    secp256k1_musig_secnonce_invalidate(ctx, secnonce, !ret);

    /* Compute pubnonce as two gejs */
    for (i = 0; i < 2; i++) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_ptj[i], &k[i]);
        secp256k1_scalar_clear(&k[i]);
    }

    /* Batch convert to two public ges */
    secp256k1_ge_set_all_gej(nonce_pts, nonce_ptj, 2);
    for (i = 0; i < 2; i++) {
        secp256k1_gej_clear(&nonce_ptj[i]);
    }

    for (i = 0; i < 2; i++) {
        secp256k1_declassify(ctx, &nonce_pts[i], sizeof(nonce_pts[i]));
    }
    /* None of the nonce_pts will be infinity because k != 0 with overwhelming
     * probability */
    secp256k1_musig_pubnonce_save(pubnonce, nonce_pts);
    return ret;
}